

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O3

string * __thiscall
glcts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  string *psVar11;
  long *plVar12;
  ulong *puVar13;
  long lVar14;
  long *plVar15;
  ulong uVar16;
  long *plVar17;
  string expr;
  string lastelemexpr;
  string decl;
  string lo;
  string sd;
  string e [4] [7];
  string l [4];
  ostringstream os;
  long *local_ad0;
  long local_ac8;
  long local_ac0;
  long lStack_ab8;
  long *local_ab0;
  long local_aa8;
  long local_aa0;
  long lStack_a98;
  long *local_a90;
  long local_a88;
  long local_a80;
  long lStack_a78;
  ulong *local_a70;
  long local_a68;
  ulong local_a60;
  long lStack_a58;
  ulong *local_a50;
  long local_a48;
  ulong local_a40;
  long lStack_a38;
  ulong *local_a30;
  long local_a28;
  ulong local_a20;
  long lStack_a18;
  ulong *local_a10;
  long local_a08;
  ulong local_a00;
  long lStack_9f8;
  ulong *local_9f0;
  long local_9e8;
  ulong local_9e0;
  long lStack_9d8;
  ulong *local_9d0;
  long local_9c8;
  ulong local_9c0;
  long lStack_9b8;
  ulong *local_9b0;
  long local_9a8;
  ulong local_9a0;
  undefined4 uStack_998;
  undefined4 uStack_994;
  ulong *local_990;
  long local_988;
  ulong local_980;
  undefined4 uStack_978;
  undefined4 uStack_974;
  ulong *local_970;
  long local_968;
  ulong local_960;
  undefined4 uStack_958;
  undefined4 uStack_954;
  ulong *local_950;
  long local_948;
  ulong local_940;
  undefined4 uStack_938;
  undefined4 uStack_934;
  ulong *local_930;
  long local_928;
  ulong local_920;
  undefined4 uStack_918;
  undefined4 uStack_914;
  long *local_910;
  undefined8 local_908;
  long local_900;
  undefined8 uStack_8f8;
  long *local_8f0;
  undefined8 local_8e8;
  long local_8e0;
  undefined8 uStack_8d8;
  long *local_8d0;
  undefined8 local_8c8;
  long local_8c0;
  undefined8 uStack_8b8;
  long *local_8b0;
  undefined8 local_8a8;
  long local_8a0;
  undefined8 uStack_898;
  long *local_890;
  undefined8 local_888;
  long local_880;
  undefined8 uStack_878;
  long *local_870;
  undefined8 local_868;
  long local_860;
  undefined8 uStack_858;
  long *local_850 [2];
  long local_840 [2];
  ulong *local_830;
  long local_828;
  ulong local_820;
  undefined4 uStack_818;
  undefined4 uStack_814;
  long *local_810 [2];
  long local_800 [2];
  long *local_7f0;
  long local_7e8;
  long local_7e0;
  long lStack_7d8;
  long *local_7d0;
  long local_7c8;
  long local_7c0;
  long lStack_7b8;
  long *local_7b0;
  long local_7a8;
  long local_7a0;
  long lStack_798;
  long *local_790;
  long local_788;
  long local_780;
  long lStack_778;
  long *local_770;
  long local_768;
  long local_760;
  long lStack_758;
  long *local_750;
  long local_748;
  long local_740;
  long lStack_738;
  long *local_730;
  long local_728;
  long local_720;
  long lStack_718;
  long *local_710;
  long local_708;
  long local_700;
  long lStack_6f8;
  long *local_6f0;
  long local_6e8;
  long local_6e0;
  long lStack_6d8;
  long *local_6d0;
  long local_6c8;
  long local_6c0;
  long lStack_6b8;
  long *local_6b0;
  long local_6a8;
  long local_6a0 [2];
  string *local_690;
  long *local_688;
  long local_680;
  long local_678;
  long lStack_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  long *local_248 [2];
  long local_238 [2];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"bvec3","");
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"vec4","");
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"ivec3","");
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"ivec3","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"uvec2","");
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vec2","");
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"uvec4","");
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"mat2","");
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"mat3","");
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mat4","");
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"mat4","");
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"mat2x3","");
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"mat3x2","");
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"mat4x2","");
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"mat2","");
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"mat3","");
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"mat4","");
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"mat4","");
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"mat2x3","");
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"mat3x2","");
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"mat4x2","");
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"S0","");
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"S1","");
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"S2","");
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"S2","");
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"S4","");
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"S5","");
  plVar17 = local_238;
  local_248[0] = plVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"S6","");
  local_6b0 = local_6a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b0,
             "\nstruct S0 {\n  float f;\n  int i;\n  uint ui;\n  bool b;\n};\nstruct S1 {\n  ivec3 iv;\n  bvec2 bv;\n  vec4 v;\n  uvec2 uv;\n};\nstruct S2 {\n  mat2x2 m22;\n  mat4x4 m44;\n  mat2x3 m23;\n  mat4x2 m42;\n  mat3x4 m34;\n};\nstruct S4 {\n  float f[1];\n  int i[2];\n  uint ui[3];\n  bool b[4];\n  ivec3 iv[5];\n  bvec2 bv[6];\n  vec4  v[7];\n  uvec2 uv[8];\n};\nstruct S5 {\n  S0 s0;\n  S1 s1;\n  S2 s2;\n};\nstruct S6 {\n  S4 s4[3];\n};"
             ,"");
  local_810[0] = local_800;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_810,0x1af8059);
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"std140","");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"std430","");
  local_1e8[0] = local_1d8;
  local_690 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"shared","");
  plVar15 = local_1b8;
  local_1c8[0] = plVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"packed","");
  std::__cxx11::string::_M_append
            ((char *)local_810,(ulong)local_228[(long)*(int *)((long)this + 0x58) * 4]);
  if (*(int *)((long)this + 0x54) == 2) {
    std::__cxx11::string::append((char *)local_810);
  }
  local_850[0] = local_840;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_850,local_6b0,local_6a8 + (long)local_6b0);
  std::__cxx11::string::append((char *)local_850);
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)local_850,(ulong)local_810[0]);
  local_7f0 = &local_7e0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_7e0 = *plVar12;
    lStack_7d8 = plVar8[3];
  }
  else {
    local_7e0 = *plVar12;
    local_7f0 = (long *)*plVar8;
  }
  local_7e8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_7f0);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_980 = *puVar13;
    uStack_978 = (undefined4)plVar8[3];
    uStack_974 = *(undefined4 *)((long)plVar8 + 0x1c);
    local_990 = &local_980;
  }
  else {
    local_980 = *puVar13;
    local_990 = (ulong *)*plVar8;
  }
  local_988 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar1 = *(char *)((long)this + 0x5c);
  if (cVar1 == '\x01') {
    std::operator+(&local_5c8,"\n  ",&local_5a8 + (long)*(int *)((long)this + 0x54) * 7);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_5c8);
    local_9d0 = &local_9c0;
    puVar13 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar13) {
      local_9c0 = *puVar13;
      lStack_9b8 = plVar8[3];
    }
    else {
      local_9c0 = *puVar13;
      local_9d0 = (ulong *)*plVar8;
    }
    local_9c8 = plVar8[1];
    *plVar8 = (long)puVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
  }
  else {
    local_9d0 = &local_9c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,0x1af8059);
  }
  uVar16 = 0xf;
  if (local_990 != &local_980) {
    uVar16 = local_980;
  }
  if (uVar16 < (ulong)(local_9c8 + local_988)) {
    uVar16 = 0xf;
    if (local_9d0 != &local_9c0) {
      uVar16 = local_9c0;
    }
    if (uVar16 < (ulong)(local_9c8 + local_988)) goto LAB_00c8e074;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9d0,0,(char *)0x0,(ulong)local_990);
  }
  else {
LAB_00c8e074:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_990,(ulong)local_9d0);
  }
  local_910 = &local_900;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_900 = *plVar8;
    uStack_8f8 = puVar9[3];
  }
  else {
    local_900 = *plVar8;
    local_910 = (long *)*puVar9;
  }
  local_908 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_910);
  local_7d0 = &local_7c0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_7c0 = *plVar12;
    lStack_7b8 = plVar8[3];
  }
  else {
    local_7c0 = *plVar12;
    local_7d0 = (long *)*plVar8;
  }
  local_7c8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_7d0,
                              (ulong)(&local_5a8)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  local_7b0 = &local_7a0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_7a0 = *plVar12;
    lStack_798 = plVar8[3];
  }
  else {
    local_7a0 = *plVar12;
    local_7b0 = (long *)*plVar8;
  }
  local_7a8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_7b0);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_960 = *puVar13;
    uStack_958 = (undefined4)plVar8[3];
    uStack_954 = *(undefined4 *)((long)plVar8 + 0x1c);
    local_970 = &local_960;
  }
  else {
    local_960 = *puVar13;
    local_970 = (ulong *)*plVar8;
  }
  local_968 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar2 = *(char *)((long)this + 0x5c);
  if (cVar2 == '\x01') {
    std::operator+(&local_5e8,"\n  ",&local_588 + (long)*(int *)((long)this + 0x54) * 7);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_5e8);
    local_9f0 = &local_9e0;
    puVar13 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar13) {
      local_9e0 = *puVar13;
      lStack_9d8 = plVar8[3];
    }
    else {
      local_9e0 = *puVar13;
      local_9f0 = (ulong *)*plVar8;
    }
    local_9e8 = plVar8[1];
    *plVar8 = (long)puVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
  }
  else {
    local_9f0 = &local_9e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f0,0x1af8059);
  }
  uVar16 = 0xf;
  if (local_970 != &local_960) {
    uVar16 = local_960;
  }
  if (uVar16 < (ulong)(local_9e8 + local_968)) {
    uVar16 = 0xf;
    if (local_9f0 != &local_9e0) {
      uVar16 = local_9e0;
    }
    if (uVar16 < (ulong)(local_9e8 + local_968)) goto LAB_00c8e33f;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9f0,0,(char *)0x0,(ulong)local_970);
  }
  else {
LAB_00c8e33f:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_970,(ulong)local_9f0);
  }
  local_8f0 = &local_8e0;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_8e0 = *plVar8;
    uStack_8d8 = puVar9[3];
  }
  else {
    local_8e0 = *plVar8;
    local_8f0 = (long *)*puVar9;
  }
  local_8e8 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_8f0);
  local_790 = &local_780;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_780 = *plVar12;
    lStack_778 = plVar8[3];
  }
  else {
    local_780 = *plVar12;
    local_790 = (long *)*plVar8;
  }
  local_788 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_790,
                              (ulong)(&local_588)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  local_770 = &local_760;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_760 = *plVar12;
    lStack_758 = plVar8[3];
  }
  else {
    local_760 = *plVar12;
    local_770 = (long *)*plVar8;
  }
  local_768 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_770);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_940 = *puVar13;
    uStack_938 = (undefined4)plVar8[3];
    uStack_934 = *(undefined4 *)((long)plVar8 + 0x1c);
    local_950 = &local_940;
  }
  else {
    local_940 = *puVar13;
    local_950 = (ulong *)*plVar8;
  }
  local_948 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar3 = *(char *)((long)this + 0x5c);
  if (cVar3 == '\x01') {
    std::operator+(&local_608,"\n  ",&local_568 + (long)*(int *)((long)this + 0x54) * 7);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_608);
    local_a10 = &local_a00;
    puVar13 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar13) {
      local_a00 = *puVar13;
      lStack_9f8 = plVar8[3];
    }
    else {
      local_a00 = *puVar13;
      local_a10 = (ulong *)*plVar8;
    }
    local_a08 = plVar8[1];
    *plVar8 = (long)puVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
  }
  else {
    local_a10 = &local_a00;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a10,0x1af8059);
  }
  uVar16 = 0xf;
  if (local_950 != &local_940) {
    uVar16 = local_940;
  }
  if (uVar16 < (ulong)(local_a08 + local_948)) {
    uVar16 = 0xf;
    if (local_a10 != &local_a00) {
      uVar16 = local_a00;
    }
    if (uVar16 < (ulong)(local_a08 + local_948)) goto LAB_00c8e607;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a10,0,(char *)0x0,(ulong)local_950);
  }
  else {
LAB_00c8e607:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_950,(ulong)local_a10);
  }
  local_8d0 = &local_8c0;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_8c0 = *plVar8;
    uStack_8b8 = puVar9[3];
  }
  else {
    local_8c0 = *plVar8;
    local_8d0 = (long *)*puVar9;
  }
  local_8c8 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_8d0);
  local_750 = &local_740;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_740 = *plVar12;
    lStack_738 = plVar8[3];
  }
  else {
    local_740 = *plVar12;
    local_750 = (long *)*plVar8;
  }
  local_748 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_750,
                              (ulong)(&local_568)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  local_730 = &local_720;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_720 = *plVar12;
    lStack_718 = plVar8[3];
  }
  else {
    local_720 = *plVar12;
    local_730 = (long *)*plVar8;
  }
  local_728 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_730);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_920 = *puVar13;
    uStack_918 = (undefined4)plVar8[3];
    uStack_914 = *(undefined4 *)((long)plVar8 + 0x1c);
    local_930 = &local_920;
  }
  else {
    local_920 = *puVar13;
    local_930 = (ulong *)*plVar8;
  }
  local_928 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar4 = *(char *)((long)this + 0x5c);
  if (cVar4 == '\x01') {
    std::operator+(&local_628,"\n  ",&local_528 + (long)*(int *)((long)this + 0x54) * 7);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_628);
    local_a30 = &local_a20;
    puVar13 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar13) {
      local_a20 = *puVar13;
      lStack_a18 = plVar8[3];
    }
    else {
      local_a20 = *puVar13;
      local_a30 = (ulong *)*plVar8;
    }
    local_a28 = plVar8[1];
    *plVar8 = (long)puVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
  }
  else {
    local_a30 = &local_a20;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,0x1af8059);
  }
  uVar16 = 0xf;
  if (local_930 != &local_920) {
    uVar16 = local_920;
  }
  if (uVar16 < (ulong)(local_a28 + local_928)) {
    uVar16 = 0xf;
    if (local_a30 != &local_a20) {
      uVar16 = local_a20;
    }
    if (uVar16 < (ulong)(local_a28 + local_928)) goto LAB_00c8e8cf;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a30,0,(char *)0x0,(ulong)local_930);
  }
  else {
LAB_00c8e8cf:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_930,(ulong)local_a30);
  }
  local_8b0 = &local_8a0;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_8a0 = *plVar8;
    uStack_898 = puVar9[3];
  }
  else {
    local_8a0 = *plVar8;
    local_8b0 = (long *)*puVar9;
  }
  local_8a8 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_8b0);
  local_710 = &local_700;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_700 = *plVar12;
    lStack_6f8 = plVar8[3];
  }
  else {
    local_700 = *plVar12;
    local_710 = (long *)*plVar8;
  }
  local_708 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_710,
                              (ulong)(&local_528)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  local_6f0 = &local_6e0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_6e0 = *plVar12;
    lStack_6d8 = plVar8[3];
  }
  else {
    local_6e0 = *plVar12;
    local_6f0 = (long *)*plVar8;
  }
  local_6e8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_6f0);
  local_9b0 = &local_9a0;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_9a0 = *puVar13;
    uStack_998 = (undefined4)plVar8[3];
    uStack_994 = *(undefined4 *)((long)plVar8 + 0x1c);
  }
  else {
    local_9a0 = *puVar13;
    local_9b0 = (ulong *)*plVar8;
  }
  local_9a8 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar5 = *(char *)((long)this + 0x5c);
  if (cVar5 == '\x01') {
    std::operator+(&local_648,"\n  ",&local_508 + (long)*(int *)((long)this + 0x54) * 7);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_648);
    local_a50 = &local_a40;
    puVar13 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar13) {
      local_a40 = *puVar13;
      lStack_a38 = plVar8[3];
    }
    else {
      local_a40 = *puVar13;
      local_a50 = (ulong *)*plVar8;
    }
    local_a48 = plVar8[1];
    *plVar8 = (long)puVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
  }
  else {
    local_a50 = &local_a40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a50,0x1af8059);
  }
  uVar16 = 0xf;
  if (local_9b0 != &local_9a0) {
    uVar16 = local_9a0;
  }
  if (uVar16 < (ulong)(local_a48 + local_9a8)) {
    uVar16 = 0xf;
    if (local_a50 != &local_a40) {
      uVar16 = local_a40;
    }
    if (uVar16 < (ulong)(local_a48 + local_9a8)) goto LAB_00c8eba0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a50,0,(char *)0x0,(ulong)local_9b0);
  }
  else {
LAB_00c8eba0:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9b0,(ulong)local_a50);
  }
  local_890 = &local_880;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_880 = *plVar8;
    uStack_878 = puVar9[3];
  }
  else {
    local_880 = *plVar8;
    local_890 = (long *)*puVar9;
  }
  local_888 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_890);
  local_6d0 = &local_6c0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_6c0 = *plVar12;
    lStack_6b8 = plVar8[3];
  }
  else {
    local_6c0 = *plVar12;
    local_6d0 = (long *)*plVar8;
  }
  local_6c8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_6d0,
                              (ulong)(&local_508)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_678 = *plVar12;
    lStack_670 = plVar8[3];
    local_688 = &local_678;
  }
  else {
    local_678 = *plVar12;
    local_688 = (long *)*plVar8;
  }
  local_680 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_688);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_820 = *puVar13;
    uStack_818 = (undefined4)plVar8[3];
    uStack_814 = *(undefined4 *)((long)plVar8 + 0x1c);
    local_830 = &local_820;
  }
  else {
    local_820 = *puVar13;
    local_830 = (ulong *)*plVar8;
  }
  local_828 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar6 = *(char *)((long)this + 0x5c);
  if (cVar6 == '\x01') {
    std::operator+(&local_668,"\n  ",&local_4e8 + (long)*(int *)((long)this + 0x54) * 7);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_668);
    local_a70 = &local_a60;
    puVar13 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar13) {
      local_a60 = *puVar13;
      lStack_a58 = plVar8[3];
    }
    else {
      local_a60 = *puVar13;
      local_a70 = (ulong *)*plVar8;
    }
    local_a68 = plVar8[1];
    *plVar8 = (long)puVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
  }
  else {
    local_a70 = &local_a60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a70,0x1af8059);
  }
  uVar16 = 0xf;
  if (local_830 != &local_820) {
    uVar16 = local_820;
  }
  if (uVar16 < (ulong)(local_a68 + local_828)) {
    uVar16 = 0xf;
    if (local_a70 != &local_a60) {
      uVar16 = local_a60;
    }
    if ((ulong)(local_a68 + local_828) <= uVar16) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a70,0,(char *)0x0,(ulong)local_830);
      goto LAB_00c8ee6c;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_830,(ulong)local_a70);
LAB_00c8ee6c:
  local_870 = &local_860;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_860 = *plVar8;
    uStack_858 = puVar9[3];
  }
  else {
    local_860 = *plVar8;
    local_870 = (long *)*puVar9;
  }
  local_868 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_870);
  local_ab0 = &local_aa0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_aa0 = *plVar12;
    lStack_a98 = plVar8[3];
  }
  else {
    local_aa0 = *plVar12;
    local_ab0 = (long *)*plVar8;
  }
  local_aa8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_ab0,
                              (ulong)(&local_4e8)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  local_ad0 = &local_ac0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_ac0 = *plVar12;
    lStack_ab8 = plVar8[3];
  }
  else {
    local_ac0 = *plVar12;
    local_ad0 = (long *)*plVar8;
  }
  local_ac8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_ad0);
  local_a90 = &local_a80;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_a80 = *plVar12;
    lStack_a78 = plVar8[3];
  }
  else {
    local_a80 = *plVar12;
    local_a90 = (long *)*plVar8;
  }
  local_a88 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,local_ac0 + 1);
  }
  if (local_ab0 != &local_aa0) {
    operator_delete(local_ab0,local_aa0 + 1);
  }
  if (local_870 != &local_860) {
    operator_delete(local_870,local_860 + 1);
  }
  if (local_a70 != &local_a60) {
    operator_delete(local_a70,local_a60 + 1);
  }
  if ((cVar6 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2)) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  if (local_830 != &local_820) {
    operator_delete(local_830,local_820 + 1);
  }
  if (local_688 != &local_678) {
    operator_delete(local_688,local_678 + 1);
  }
  if (local_6d0 != &local_6c0) {
    operator_delete(local_6d0,local_6c0 + 1);
  }
  if (local_890 != &local_880) {
    operator_delete(local_890,local_880 + 1);
  }
  if (local_a50 != &local_a40) {
    operator_delete(local_a50,local_a40 + 1);
  }
  if ((cVar5 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2)) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  if (local_9b0 != &local_9a0) {
    operator_delete(local_9b0,local_9a0 + 1);
  }
  if (local_6f0 != &local_6e0) {
    operator_delete(local_6f0,local_6e0 + 1);
  }
  if (local_710 != &local_700) {
    operator_delete(local_710,local_700 + 1);
  }
  if (local_8b0 != &local_8a0) {
    operator_delete(local_8b0,local_8a0 + 1);
  }
  if (local_a30 != &local_a20) {
    operator_delete(local_a30,local_a20 + 1);
  }
  if ((cVar4 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2)) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if (local_930 != &local_920) {
    operator_delete(local_930,local_920 + 1);
  }
  if (local_730 != &local_720) {
    operator_delete(local_730,local_720 + 1);
  }
  if (local_750 != &local_740) {
    operator_delete(local_750,local_740 + 1);
  }
  if (local_8d0 != &local_8c0) {
    operator_delete(local_8d0,local_8c0 + 1);
  }
  if (local_a10 != &local_a00) {
    operator_delete(local_a10,local_a00 + 1);
  }
  if ((cVar3 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2)) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if (local_950 != &local_940) {
    operator_delete(local_950,local_940 + 1);
  }
  if (local_770 != &local_760) {
    operator_delete(local_770,local_760 + 1);
  }
  if (local_790 != &local_780) {
    operator_delete(local_790,local_780 + 1);
  }
  if (local_8f0 != &local_8e0) {
    operator_delete(local_8f0,local_8e0 + 1);
  }
  if (local_9f0 != &local_9e0) {
    operator_delete(local_9f0,local_9e0 + 1);
  }
  if ((cVar2 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2)) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if (local_970 != &local_960) {
    operator_delete(local_970,local_960 + 1);
  }
  if (local_7b0 != &local_7a0) {
    operator_delete(local_7b0,local_7a0 + 1);
  }
  if (local_7d0 != &local_7c0) {
    operator_delete(local_7d0,local_7c0 + 1);
  }
  if (local_910 != &local_900) {
    operator_delete(local_910,local_900 + 1);
  }
  if (local_9d0 != &local_9c0) {
    operator_delete(local_9d0,local_9c0 + 1);
  }
  if ((cVar1 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2)) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if (local_990 != &local_980) {
    operator_delete(local_990,local_980 + 1);
  }
  if (local_7f0 != &local_7e0) {
    operator_delete(local_7f0,local_7e0 + 1);
  }
  if (local_850[0] != local_840) {
    operator_delete(local_850[0],local_840[0] + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "\n  g_length[0] = g_input0.length();\n  g_length[1] = g_input1.data.length();\n  g_length[2] = g_input23[0].data.length();\n  g_length[3] = g_input23[1].data.length();\n  g_length[4] = g_output0.data.length();\n  g_length[5] = g_input4.data.length();\n  g_length[6] = g_output1.data.length();"
             ,"");
  local_ab0 = &local_aa0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ab0,
             "\n  g_output0.data[g_output0.data.length()-2] += g_output0.data[g_output0.data.length()-1];\n  g_output1.data[g_output1.data.length()-2] += g_output1.data[g_output1.data.length()-1];"
             ,"");
  if (*(char *)((long)this + 100) == '\x01') {
    std::__cxx11::string::_M_append((char *)&local_ad0,(ulong)local_ab0);
  }
  iVar7 = *(int *)((long)this + 0x50);
  if (iVar7 == 0) {
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_a90,local_a88);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               "\nvoid main() {\n#ifdef GL_ES\n  gl_PointSize = 1.0f;\n#endif\n  gl_Position = vec4(0,0,0,1);"
               ,0x58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_ad0,local_ac8);
    iVar7 = *(int *)((long)this + 0x50);
  }
  if (iVar7 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nlayout(location = 0) out vec4 o_color;",0x27);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_a90,local_a88);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);",0x34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_ad0,local_ac8);
    iVar7 = *(int *)((long)this + 0x50);
  }
  if (iVar7 == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nlayout(local_size_x = 1) in;",0x1d);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_a90,local_a88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nvoid main() {",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_ad0,local_ac8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n}",2);
  std::__cxx11::stringbuf::str();
  if (local_ab0 != &local_aa0) {
    operator_delete(local_ab0,local_aa0 + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,local_ac0 + 1);
  }
  if (local_a90 != &local_a80) {
    operator_delete(local_a90,local_a80 + 1);
  }
  lVar14 = -0x80;
  do {
    if (plVar15 != (long *)plVar15[-2]) {
      operator_delete((long *)plVar15[-2],*plVar15 + 1);
    }
    plVar15 = plVar15 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  if (local_810[0] != local_800) {
    operator_delete(local_810[0],local_800[0] + 1);
  }
  if (local_6b0 != local_6a0) {
    operator_delete(local_6b0,local_6a0[0] + 1);
  }
  lVar14 = -0x380;
  do {
    if (plVar17 != (long *)plVar17[-2]) {
      operator_delete((long *)plVar17[-2],*plVar17 + 1);
    }
    plVar17 = plVar17 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar11 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar11;
}

Assistant:

std::string BuildShader()
	{
		std::ostringstream os;
		std::string		   e[4][7] = { { "bvec3", "vec4", "ivec3", "ivec3", "uvec2", "vec2", "uvec4" },
								{ "mat2", "mat3", "mat4", "mat4", "mat2x3", "mat3x2", "mat4x2" },
								{ "mat2", "mat3", "mat4", "mat4", "mat2x3", "mat3x2", "mat4x2" },
								{ "S0", "S1", "S2", "S2", "S4", "S5", "S6" } };
		std::string sd =
			NL "struct S0 {" NL "  float f;" NL "  int i;" NL "  uint ui;" NL "  bool b;" NL "};" NL "struct S1 {" NL
			   "  ivec3 iv;" NL "  bvec2 bv;" NL "  vec4 v;" NL "  uvec2 uv;" NL "};" NL "struct S2 {" NL
			   "  mat2x2 m22;" NL "  mat4x4 m44;" NL "  mat2x3 m23;" NL "  mat4x2 m42;" NL "  mat3x4 m34;" NL "};" NL
			   "struct S4 {" NL "  float f[1];" NL "  int i[2];" NL "  uint ui[3];" NL "  bool b[4];" NL
			   "  ivec3 iv[5];" NL "  bvec2 bv[6];" NL "  vec4  v[7];" NL "  uvec2 uv[8];" NL "};" NL "struct S5 {" NL
			   "  S0 s0;" NL "  S1 s1;" NL "  S2 s2;" NL "};" NL "struct S6 {" NL "  S4 s4[3];" NL "};";

		std::string lo   = "";
		std::string l[4] = { "std140", "std430", "shared", "packed" };
		lo += l[layout];
		if (etype == matrix_rm)
			lo += ", row_major";

		std::string decl = sd + NL "layout(" + lo + ") buffer;" NL "layout(binding = 0) readonly buffer Input0 {" +
						   ((other_members) ? ("\n  " + e[etype][0] + " pad0;") : "") + NL "  " + e[etype][0] +
						   " g_input0[];" NL "};" NL "layout(binding = 1) readonly buffer Input1 {" +
						   ((other_members) ? ("\n  " + e[etype][1] + " pad1;") : "") + NL "  " + e[etype][1] +
						   " data[];" NL "} g_input1;" NL "layout(binding = 2) readonly buffer Input23 {" +
						   ((other_members) ? ("\n  " + e[etype][2] + " pad2;") : "") + NL "  " + e[etype][2] +
						   " data[];" NL "} g_input23[2];" NL "layout(binding = 4) buffer Output0 {" +
						   ((other_members) ? ("\n  " + e[etype][4] + " pad4;") : "") + NL "  " + e[etype][4] +
						   " data[];" NL "} g_output0;" NL "layout(binding = 5) readonly buffer Input4 {" +
						   ((other_members) ? ("\n  " + e[etype][5] + " pad5;") : "") + NL "  " + e[etype][5] +
						   " data[];" NL "} g_input4;" NL "layout(binding = 6) buffer Output1 {" +
						   ((other_members) ? ("\n  " + e[etype][6] + " pad6;") : "") + NL "  " + e[etype][6] +
						   " data[];" NL "} g_output1;" NL "layout(std430, binding = 7) buffer Output {" NL
						   "  int g_length[];" NL "};";
		std::string expr =
			NL "  g_length[0] = g_input0.length();" NL "  g_length[1] = g_input1.data.length();" NL
			   "  g_length[2] = g_input23[0].data.length();" NL "  g_length[3] = g_input23[1].data.length();" NL
			   "  g_length[4] = g_output0.data.length();" NL "  g_length[5] = g_input4.data.length();" NL
			   "  g_length[6] = g_output1.data.length();";
		std::string lastelemexpr =
			NL "  g_output0.data[g_output0.data.length()-2] += g_output0.data[g_output0.data.length()-1];" NL
			   "  g_output1.data[g_output1.data.length()-2] += g_output1.data[g_output1.data.length()-1];";
		if (length_as_index)
			expr += lastelemexpr;
		if (stage == vertex)
		{
			os << decl << NL "void main() {" NL "#ifdef GL_ES" NL "  gl_PointSize = 1.0f;" NL "#endif" NL
							 "  gl_Position = vec4(0,0,0,1);"
			   << expr;
		}
		if (stage == fragment)
		{
			os << NL "layout(location = 0) out vec4 o_color;" << decl
			   << NL "void main() {" NL "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" << expr;
		}
		if (stage == compute)
		{
			os << NL "layout(local_size_x = 1) in;" << decl << NL "void main() {" << expr;
		}
		os << NL "}";
		return os.str();
	}